

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_lu.c
# Opt level: O0

_Bool test_lu_mul_x(_Bool inplace,int n_row,int n_col,int N,int field)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint8_t *__n;
  uint8_t *__n_00;
  uint8_t *memory;
  uint8_t *memory_00;
  ulong uVar5;
  uint8_t *puVar6;
  int *inverted_out;
  int *orig;
  uint8_t *puVar7;
  uint8_t auStackY_1b0 [8];
  int aiStackY_1a8 [2];
  int aiStackY_1a0 [2];
  undefined8 local_198;
  int in_stack_fffffffffffffe70;
  uint8_t local_188 [4];
  int iStack_184;
  uint8_t local_180 [8];
  uint8_t local_178 [8];
  uint8_t local_170 [8];
  int local_168 [6];
  int local_150 [2];
  uint8_t local_148 [8];
  uint8_t local_140 [8];
  uint8_t auStack_138 [4];
  int local_134;
  uint8_t local_130 [12];
  int local_124;
  unsigned_long __vla_expr7;
  undefined1 local_100 [8];
  m256v Y2;
  uint8_t *y2;
  unsigned_long __vla_expr6;
  unsigned_long __vla_expr5;
  unsigned_long __vla_expr4;
  m256v LU;
  unsigned_long __vla_expr3;
  m256v Y1;
  unsigned_long __vla_expr2;
  m256v X;
  m256v Xi;
  unsigned_long __vla_expr1;
  m256v A;
  unsigned_long __vla_expr0;
  int local_28;
  int i;
  int dlen;
  uint8_t mask;
  int field_local;
  int N_local;
  int n_col_local;
  int n_row_local;
  _Bool inplace_local;
  
  get_mask(in_stack_fffffffffffffe70);
  local_28 = 0;
  while( true ) {
    if (N <= local_28) {
      return true;
    }
    lVar1 = -((ulong)((uint8_t *)(ulong)(uint)(n_row * n_col) + 0xf) & 0xfffffffffffffff0);
    puVar6 = (uint8_t *)((long)&local_198 + lVar1);
    A.e = (uint8_t *)(ulong)(uint)(n_row * n_col);
    *(undefined8 *)((long)aiStackY_1a0 + lVar1) = 0x101cd3;
    rand_coeffs(*(uint8_t **)(local_170 + lVar1 + -0x20),*(int *)((long)&local_198 + lVar1 + 4),
                *(uint8_t *)((long)&local_198 + lVar1 + 3));
    *(undefined8 *)((long)aiStackY_1a0 + lVar1) = 0x101ce9;
    m256v_make((m256v *)&__vla_expr1,n_row,n_col,puVar6);
    local_124 = n_col;
    if ((inplace) && (n_col < n_row)) {
      local_124 = n_row;
    }
    lVar1 = -((ulong)(uint)(local_124 << 3) + 0xf & 0xfffffffffffffff0);
    puVar7 = puVar6 + lVar1;
    builtin_memcpy(puVar6 + lVar1 + -8,"B\x1d\x10",4);
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    rand_coeffs(*(uint8_t **)(puVar7 + 8),*(int *)(puVar7 + 4),puVar7[3]);
    local_134 = n_col;
    if ((inplace) && (n_col < n_row)) {
      local_134 = n_row;
    }
    puVar7[-8] = 0x85;
    puVar7[-7] = '\x1d';
    puVar7[-6] = '\x10';
    puVar7[-5] = '\0';
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    m256v_make((m256v *)&X.e,local_134,8,puVar7);
    puVar7[-8] = 0xa5;
    puVar7[-7] = '\x1d';
    puVar7[-6] = '\x10';
    puVar7[-5] = '\0';
    puVar7[-4] = '\0';
    puVar7[-3] = '\0';
    puVar7[-2] = '\0';
    puVar7[-1] = '\0';
    m256v_make((m256v *)&__vla_expr2,n_col,8,puVar7);
    __n = (uint8_t *)(ulong)(uint)(n_row << 3);
    lVar2 = -((ulong)(__n + 0xf) & 0xfffffffffffffff0);
    memory = puVar7 + lVar2;
    Y1.e = __n;
    memory[-8] = 0xf0;
    memory[-7] = '\x1d';
    memory[-6] = '\x10';
    memory[-5] = '\0';
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_make((m256v *)&__vla_expr3,n_row,8,memory);
    builtin_memcpy(puVar6 + lVar2 + lVar1 + -8,"\a\x1e\x10",4);
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_mul(*(m256v **)(memory + 0x28),*(m256v **)(memory + 0x20),*(m256v **)(memory + 0x18));
    __n_00 = (uint8_t *)(ulong)(uint)(n_row * n_col);
    lVar3 = -((ulong)(__n_00 + 0xf) & 0xfffffffffffffff0);
    memory_00 = memory + lVar3;
    LU.e = __n_00;
    builtin_memcpy(puVar6 + lVar3 + lVar2 + lVar1 + -8,"R\x1e\x10",4);
    memory_00[-4] = '\0';
    memory_00[-3] = '\0';
    memory_00[-2] = '\0';
    memory_00[-1] = '\0';
    m256v_make((m256v *)&__vla_expr4,n_row,n_col,memory_00);
    builtin_memcpy(puVar6 + lVar3 + lVar2 + lVar1 + -8,"l\x1e\x10",4);
    memory_00[-4] = '\0';
    memory_00[-3] = '\0';
    memory_00[-2] = '\0';
    memory_00[-1] = '\0';
    memcpy(memory_00,puVar6,(size_t)__n_00);
    orig = (int *)(memory_00 + -((ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0));
    uVar5 = (ulong)(uint)n_col * 4 + 0xf & 0xfffffffffffffff0;
    *(undefined8 *)((long)orig + (-8 - uVar5)) = 0x101ec4;
    m256v_LU_decomp_inplace
              (*(m256v **)((long)orig + (0x28 - uVar5)),*(int **)((long)orig + (0x20 - uVar5)),
               *(int **)((long)orig + (0x18 - uVar5)));
    puVar6 = (uint8_t *)
             ((long)orig + (-((ulong)(uint)(n_row << 3) + 0xf & 0xfffffffffffffff0) - uVar5));
    if (inplace) {
      inverted_out = (int *)(puVar6 + -((ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0));
      local_198 = inverted_out;
      inverted_out[-2] = 0x101f81;
      inverted_out[-1] = 0;
      perm_invert(n_row,orig,inverted_out);
      inverted_out[-2] = 0x101f9f;
      inverted_out[-1] = 0;
      m256v_LU_mult_inplace
                (*(m256v **)(inverted_out + 0x12),*(int **)(inverted_out + 0x10),
                 *(int **)(inverted_out + 0xe),*(m256v **)(inverted_out + 0xc));
      Y2.e = puVar7;
    }
    else {
      builtin_memcpy(puVar6 + -8,"\r\x1f\x10",4);
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      m256v_make((m256v *)local_100,n_row,8,puVar6);
      builtin_memcpy(puVar6 + -8,"2\x1f\x10",4);
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      m256v_LU_mult(*(m256v **)(puVar6 + 0x68),*(int **)(puVar6 + 0x60),*(int **)(puVar6 + 0x58),
                    *(m256v **)(puVar6 + 0x50),*(m256v **)(puVar6 + 0x48));
      Y2.e = puVar6;
    }
    puVar7 = Y2.e;
    puVar6[-8] = 0xd1;
    puVar6[-7] = '\x1f';
    puVar6[-6] = '\x10';
    puVar6[-5] = '\0';
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    iVar4 = memcmp(memory,puVar7,(size_t)__n);
    if (iVar4 != 0) break;
    local_28 = local_28 + 1;
  }
  *(int *)(puVar6 + -0x10) = local_28;
  puVar6[-0x18] = '\x0f';
  puVar6[-0x17] = ' ';
  puVar6[-0x16] = '\x10';
  puVar6[-0x15] = '\0';
  puVar6[-0x14] = '\0';
  puVar6[-0x13] = '\0';
  puVar6[-0x12] = '\0';
  puVar6[-0x11] = '\0';
  fprintf(_stderr,"Error:  A*X != PLUQ*X. (inplace=%d, n_row=%d, n_col=%d, field=%d, it=%d)\n",
          (ulong)inplace,(ulong)(uint)n_row,(ulong)(uint)n_col,(ulong)(uint)field);
  puVar6[-8] = '+';
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  fprintf(_stderr,"        Details about the test case:\n");
  puVar6[-8] = 'C';
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  fprintf(_stderr,"        rp = ");
  puVar6[-8] = '\\';
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  print_int_arr(*(FILE **)(puVar6 + 0x18),*(int *)(puVar6 + 0x14),*(int **)(puVar6 + 8));
  puVar6[-8] = 't';
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  fprintf(_stderr,"        cp = ");
  puVar6[-8] = 0x8d;
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  print_int_arr(*(FILE **)(puVar6 + 0x18),*(int *)(puVar6 + 0x14),*(int **)(puVar6 + 8));
  puVar6[-8] = 0xa5;
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  fprintf(_stderr,"        matrix A:\n");
  puVar6[-8] = 0xbf;
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  print_mat(*(FILE **)(puVar6 + 0x18),*(char **)(puVar6 + 0x10),*(m256v **)(puVar6 + 8));
  puVar6[-8] = 0xd7;
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  fprintf(_stderr,"        matrix LU:\n");
  puVar6[-8] = 0xf4;
  puVar6[-7] = ' ';
  puVar6[-6] = '\x10';
  puVar6[-5] = '\0';
  puVar6[-4] = '\0';
  puVar6[-3] = '\0';
  puVar6[-2] = '\0';
  puVar6[-1] = '\0';
  print_mat(*(FILE **)(puVar6 + 0x18),*(char **)(puVar6 + 0x10),*(m256v **)(puVar6 + 8));
  return false;
}

Assistant:

static bool test_lu_mul_x(bool inplace, int n_row, int n_col, int N, int field)
{
	const uint8_t mask = get_mask(field);
	const int dlen = 8;

	for (int i = 0; i < N; ++i) {
		/* Create a random matrix */
		Def_mat256_rand(A, a, n_row, n_col, mask)
		Def_mat256_rand(Xi, x,
			(inplace && n_row > n_col) ? n_row : n_col,
			dlen, mask)
		m256v X = m256v_make(n_col, dlen, x);

		/* Compute A*X the direct way */
		m256v_Def(Y1, y1, n_row, dlen)
		m256v_mul(&A, &X, &Y1);

		/* Copy A -> LU */
		m256v_Def(LU, lu, n_row, n_col)
		memcpy(lu, a, sizeof(lu));

		/* Calculate LU decomposition */
		int rp[n_row], cp[n_col];
		m256v_LU_decomp_inplace(&LU, rp, cp);

		/* Compute A*X via LU decomposition */
		uint8_t y2_back[n_row * dlen];
		uint8_t* y2;
		if (!inplace) {
			/* non-inplace.  Test m256v_LU_mult */
			m256v Y2 = m256v_make(n_row, dlen, y2_back);
			m256v_LU_mult(&LU, rp, cp, &X, &Y2);

			y2 = y2_back;
		} else {
			/* inplace.  Test m256v_LU_mult_inplace */
			int inv_rp[n_row];
			perm_invert(n_row, rp, inv_rp);
			m256v_LU_mult_inplace(&LU,
						inv_rp,
						cp,
						&Xi);

			y2 = x;
		}

		/* Compare */
		if (memcmp(y1, y2, sizeof(y1)) != 0) {
			fprintf(stderr, "Error:  A*X != PLUQ*X. "
			  "(inplace=%d, n_row=%d, n_col=%d, field=%d, it=%d)\n",
			  inplace, n_row, n_col, field, i);

			/* Print details on the test case */
			fprintf(stderr, "        Details about the "
			  "test case:\n");
			fprintf(stderr, "        rp = ");
			print_int_arr(stderr, n_row, rp);
			fprintf(stderr, "        cp = ");
			print_int_arr(stderr, n_col, cp);
			fprintf(stderr, "        matrix A:\n");
			print_mat(stderr, "        ", &A);
			fprintf(stderr, "        matrix LU:\n");
			print_mat(stderr, "        ", &LU);
			return false;
		}

	}
	return true;
}